

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forrest_tomlin.cc
# Opt level: O0

void __thiscall ipx::ForrestTomlin::ComputeSpike(ForrestTomlin *this,Int nb,Int *bi,double *bx)

{
  size_type sVar1;
  reference pvVar2;
  double *pdVar3;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  double dVar4;
  int in_stack_00000044;
  char *in_stack_00000048;
  Int p_1;
  Int k;
  Int p;
  Vector *in_stack_00000058;
  SparseMatrix *in_stack_00000060;
  Int num_updates;
  double *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int iVar5;
  valarray<double> *in_stack_ffffffffffffff88;
  SparseMatrix *in_stack_ffffffffffffff90;
  valarray<double> *in_stack_ffffffffffffffa0;
  valarray<double> *in_stack_ffffffffffffffa8;
  SparseMatrix *in_stack_ffffffffffffffb0;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  
  sVar1 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x220));
  std::valarray<double>::operator=
            ((valarray<double> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             in_stack_ffffffffffffff78);
  for (local_34 = 0; local_34 < in_ESI; local_34 = local_34 + 1) {
    in_stack_ffffffffffffffb0 = *(SparseMatrix **)(in_RCX + (long)local_34 * 8);
    in_stack_ffffffffffffffa8 = (valarray<double> *)(in_RDI + 0x250);
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x58),
                        (long)*(int *)(in_RDX + (long)local_34 * 4));
    pdVar3 = std::valarray<double>::operator[](in_stack_ffffffffffffffa8,(long)*pvVar2);
    *pdVar3 = (double)in_stack_ffffffffffffffb0;
  }
  TriangularSolve(in_stack_00000060,in_stack_00000058,p._3_1_,in_stack_00000048,in_stack_00000044);
  for (local_38 = 0; local_38 < (int)sVar1; local_38 = local_38 + 1) {
    in_stack_ffffffffffffff88 = (valarray<double> *)(in_RDI + 0x250);
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x220),(long)local_38);
    pdVar3 = std::valarray<double>::operator[](in_stack_ffffffffffffff88,(long)*pvVar2);
    in_stack_ffffffffffffff90 = (SparseMatrix *)*pdVar3;
    dVar4 = DotColumn(in_stack_ffffffffffffffb0,(Int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                      in_stack_ffffffffffffffa0);
    dVar4 = (double)in_stack_ffffffffffffff90 - dVar4;
    pdVar3 = std::valarray<double>::operator[]
                       ((valarray<double> *)(in_RDI + 0x250),
                        (long)(*(int *)(in_RDI + 0x18) + local_38));
    *pdVar3 = dVar4;
    in_stack_ffffffffffffffa0 = (valarray<double> *)(in_RDI + 0x250);
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x220),(long)local_38);
    pdVar3 = std::valarray<double>::operator[](in_stack_ffffffffffffffa0,(long)*pvVar2);
    *pdVar3 = 0.0;
  }
  SparseMatrix::clear_queue
            ((SparseMatrix *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  for (local_3c = 0; local_3c < *(int *)(in_RDI + 0x18) + (int)sVar1; local_3c = local_3c + 1) {
    pdVar3 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 0x250),(long)local_3c);
    if ((*pdVar3 != 0.0) || (NAN(*pdVar3))) {
      iVar5 = local_3c;
      std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 0x250),(long)local_3c);
      SparseMatrix::push_back
                (in_stack_ffffffffffffff90,(Int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                 (double)CONCAT44(iVar5,in_stack_ffffffffffffff80));
    }
  }
  *(undefined1 *)(in_RDI + 0x23d) = 1;
  return;
}

Assistant:

void ForrestTomlin::ComputeSpike(Int nb, const Int* bi, const double* bx) {
    Int num_updates = replaced_.size();

    // Solve L*lhs=b.
    work_ = 0.0;
    for (Int p = 0; p < nb; p++)
        work_[rowperm_inv_[bi[p]]] = bx[p];
    TriangularSolve(L_, work_, 'n', "lower", 1);

    // Apply update etas.
    for (Int k = 0; k < num_updates; k++) {
        work_[dim_+k] = work_[replaced_[k]] - DotColumn(R_, k, work_);
        work_[replaced_[k]] = 0.0;
    }

    // Store spike in U. Indices are sorted, which is required for the sparse
    // dot product in Update().
    U_.clear_queue();
    for (Int p = 0; p < dim_+num_updates; p++) {
        if (work_[p] != 0.0)
            U_.push_back(p, work_[p]);
    }
    have_ftran_ = true;
}